

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void subwindows_set_flags(uint32_t *new_flags,size_t n_subwindows)

{
  term *ptVar1;
  uint uVar2;
  term *t;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  term *ptVar7;
  char **ppcVar8;
  undefined8 uVar9;
  game_event_type *pgVar10;
  code *pcVar11;
  code *pcVar12;
  long lVar13;
  
  sVar5 = 0;
  do {
    t = Term;
    if (sVar5 == n_subwindows) {
      return;
    }
    if ((angband_term[sVar5] != (term *)0x0) &&
       (uVar2 = new_flags[sVar5], window_flag[sVar5] != uVar2)) {
      iVar3 = (int)sVar5;
      ptVar1 = (term *)(minimap_data + iVar3);
      ppcVar8 = window_flag_desc;
      for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
        if (*ppcVar8 == (char *)0x0) goto switchD_001b02da_caseD_3;
        uVar4 = 1 << ((byte)lVar13 & 0x1f);
        uVar6 = uVar4 & uVar2;
        if (uVar6 == (window_flag[iVar3] & uVar4)) goto switchD_001b02da_caseD_3;
        pcVar11 = event_add_handler;
        if (uVar6 == 0) {
          pcVar11 = event_remove_handler;
        }
        pcVar12 = event_add_handler_set;
        if (uVar6 == 0) {
          pcVar12 = event_remove_handler_set;
        }
        switch(uVar4) {
        case 1:
          ptVar7 = angband_term[iVar3];
          uVar9 = 0x18;
          pcVar12 = update_inven_subwindow;
          break;
        case 2:
          ptVar7 = angband_term[iVar3];
          uVar9 = 0x19;
          pcVar12 = update_equip_subwindow;
          break;
        case 3:
        case 5:
        case 6:
        case 7:
          goto switchD_001b02da_caseD_3;
        case 4:
          ptVar7 = angband_term[iVar3];
          pgVar10 = player_events;
          uVar9 = 0xd;
          pcVar11 = update_player0_subwindow;
          goto LAB_001b0382;
        case 8:
          ptVar7 = angband_term[iVar3];
          pgVar10 = player_events;
          uVar9 = 0xd;
          pcVar11 = update_player1_subwindow;
LAB_001b0382:
          (*pcVar12)(pgVar10,uVar9,pcVar11,ptVar7);
          goto switchD_001b02da_caseD_3;
        default:
          if (uVar4 == 0x10) {
            ptVar7 = angband_term[iVar3];
            pgVar10 = player_events;
            uVar9 = 0xd;
            pcVar11 = update_player_compact_subwindow;
            goto LAB_001b0382;
          }
          if (uVar4 == 0x20) {
            *(int *)&ptVar1->user = iVar3;
            (*pcVar11)(0,update_minimap_subwindow);
            (*pcVar11)(10,update_minimap_subwindow,ptVar1);
            uVar9 = 0x40;
            pcVar12 = update_minimap_subwindow;
            ptVar7 = ptVar1;
          }
          else if (uVar4 == 0x40) {
            uVar9 = 0x1e;
            pcVar12 = update_messages_subwindow;
            ptVar7 = angband_term[iVar3];
          }
          else if (uVar4 == 0x80) {
            (*pcVar11)(0,update_maps,angband_term[iVar3]);
            uVar9 = 0x40;
            pcVar12 = flush_subwindow;
            ptVar7 = angband_term[iVar3];
          }
          else if (uVar4 == 0x100) {
            uVar9 = 0x1c;
            pcVar12 = update_monster_subwindow;
            ptVar7 = angband_term[iVar3];
          }
          else if (uVar4 == 0x200) {
            uVar9 = 0x1d;
            pcVar12 = update_object_subwindow;
            ptVar7 = angband_term[iVar3];
          }
          else if (uVar4 == 0x400) {
            uVar9 = 0x1b;
            pcVar12 = update_monlist_subwindow;
            ptVar7 = angband_term[iVar3];
          }
          else {
            if (uVar4 != 0x1000) {
              if (uVar4 != 0x2000) goto switchD_001b02da_caseD_3;
              (*pcVar12)(player_events,0xd,update_topbar_subwindow,angband_term[iVar3]);
              ptVar7 = angband_term[iVar3];
              pgVar10 = statusline_events;
              uVar9 = 6;
              pcVar11 = update_topbar_subwindow;
              goto LAB_001b0382;
            }
            uVar9 = 0x1a;
            pcVar12 = update_itemlist_subwindow;
            ptVar7 = angband_term[iVar3];
          }
        }
        (*pcVar11)(uVar9,pcVar12,ptVar7);
switchD_001b02da_caseD_3:
        ppcVar8 = ppcVar8 + 1;
      }
      window_flag[iVar3] = uVar2;
      Term_activate(angband_term[iVar3]);
      Term_clear();
      Term_fresh();
      Term_activate(t);
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

void subwindows_set_flags(uint32_t *new_flags, size_t n_subwindows)
{
	size_t j;

	for (j = 0; j < n_subwindows; j++) {
		/* Dead window */
		if (!angband_term[j]) continue;

		/* Ignore non-changes */
		if (window_flag[j] != new_flags[j])
			subwindow_set_flags(j, new_flags[j]);
	}
}